

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O1

void UnitTest::
     ExecuteTest<SuiteSessionTests::acceptorT11FixturenextResendRequestT1142RepeatingGroupHelper>
               (acceptorT11FixturenextResendRequestT1142RepeatingGroupHelper *testObject,
               TestDetails *details)

{
  int iVar1;
  TestDetails **ppTVar2;
  undefined8 *puVar3;
  SignalTranslator sig;
  SignalTranslator local_490;
  
  ppTVar2 = CurrentTest::Details();
  *ppTVar2 = details;
  SignalTranslator::SignalTranslator(&local_490);
  iVar1 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar1 == 0) {
    SuiteSessionTests::acceptorT11FixturenextResendRequestT1142RepeatingGroupHelper::RunImpl
              (testObject);
    SignalTranslator::~SignalTranslator(&local_490);
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "Unhandled system exception";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}